

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spcdas.cpp
# Opt level: O1

void disas(byte o,char *s,byte a,byte b,byte c,byte d)

{
  byte bVar1;
  size_t sVar2;
  size_t sVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  char *__s;
  char *__format;
  undefined7 in_register_00000039;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  char t [16];
  char ws [4096];
  int local_1064;
  uint local_1050;
  char local_1048 [16];
  char local_1038 [4104];
  
  uVar8 = (uint)d;
  uVar7 = (uint)c;
  uVar4 = (uint)b;
  uVar5 = (uint)a;
  __s = (char *)(CONCAT71(in_register_00000039,o) & 0xffffffff);
  if (spc.addr) {
    sprintf(local_1038,"%04x: ",(ulong)spc.pc);
  }
  else {
    local_1038[0] = '\0';
  }
  if (spc.hex == true) {
    if ((char)__s == '\0') {
      lVar13 = 0;
    }
    else {
      __s = "%02x ";
      lVar13 = 0;
      do {
        sprintf(local_1048,"%02x ",(ulong)spc.mem[(ulong)spc.pc + lVar13]);
        strcat(local_1038,local_1048);
        lVar13 = lVar13 + 1;
      } while ((uint)o != (uint)lVar13);
    }
    if ((uint)lVar13 < 3) {
      iVar12 = (uint)lVar13 - 3;
      __s = local_1038;
      do {
        sVar2 = strlen(__s);
        builtin_strncpy(local_1038 + sVar2,"   ",4);
        iVar12 = iVar12 + 1;
      } while (iVar12 != 0);
    }
    sVar2 = strlen(local_1038);
    (local_1038 + sVar2)[0] = ' ';
    (local_1038 + sVar2)[1] = '\0';
  }
  sVar2 = strlen(local_1038);
  sVar3 = strlen(s);
  if ((int)sVar3 < 1) {
    uVar10 = (uint)sVar2;
  }
  else {
    local_1064 = 0;
    iVar12 = 0;
    do {
      iVar11 = (int)sVar2;
      if (s[iVar12] == '*') {
        bVar1 = s[(long)iVar12 + 1];
        if (bVar1 < 0x72) {
          if (bVar1 == 0x62) {
            uVar10 = uVar5;
            switch(local_1064) {
            case 0:
              break;
            case 1:
              uVar10 = uVar4;
              break;
            case 2:
              uVar10 = uVar7;
              break;
            case 3:
              uVar10 = uVar8;
              break;
            default:
              goto switchD_001013de_default;
            }
            __s = (char *)(ulong)spc.mem[(ulong)spc.pc + (ulong)uVar10];
switchD_001013de_default:
            uVar6 = (ulong)__s & 0xff;
            __format = "%02x";
            goto LAB_0010152b;
          }
          if (bVar1 == 0x6d) {
            uVar10 = uVar5;
            switch(local_1064) {
            case 0:
              break;
            case 1:
              uVar10 = uVar4;
              break;
            case 2:
              uVar10 = uVar7;
              break;
            case 3:
              uVar10 = uVar8;
              break;
            default:
              goto switchD_00101363_default;
            }
            __s = (char *)(ulong)*(ushort *)(spc.mem + (ulong)uVar10 + (ulong)spc.pc);
switchD_00101363_default:
            local_1064 = local_1064 + 1;
            sprintf(local_1048,"%04x,%d",(ulong)((uint)__s & 0x1fff),(ulong)__s >> 0xd & 0x7ffff);
          }
        }
        else {
          if (bVar1 == 0x72) {
            uVar10 = uVar5;
            switch(local_1064) {
            case 0:
              break;
            case 1:
              uVar10 = uVar4;
              break;
            case 2:
              uVar10 = uVar7;
              break;
            case 3:
              uVar10 = uVar8;
              break;
            default:
              goto switchD_0010140a_default;
            }
            __s = (char *)(ulong)spc.mem[(ulong)spc.pc + (ulong)uVar10];
switchD_0010140a_default:
            if (spc.rel != true) goto switchD_001013de_default;
            local_1050 = (uint)o;
            __s = (char *)(ulong)((int)(char)__s + local_1050 + (uint)spc.pc);
          }
          else {
            if (bVar1 != 0x77) goto LAB_00101532;
            uVar10 = uVar5;
            switch(local_1064) {
            case 0:
              break;
            case 1:
              uVar10 = uVar4;
              break;
            case 2:
              uVar10 = uVar7;
              break;
            case 3:
              uVar10 = uVar8;
              break;
            default:
              goto switchD_001013b2_default;
            }
            __s = (char *)(ulong)*(ushort *)(spc.mem + (ulong)uVar10 + (ulong)spc.pc);
          }
switchD_001013b2_default:
          uVar6 = (ulong)__s & 0xffff;
          __format = "%04x";
LAB_0010152b:
          local_1064 = local_1064 + 1;
          sprintf(local_1048,__format,uVar6);
        }
LAB_00101532:
        iVar12 = iVar12 + 1;
        local_1038[iVar11] = '\0';
        strcat(local_1038,local_1048);
        sVar2 = strlen(local_1048);
        iVar9 = (int)sVar2;
      }
      else {
        local_1038[iVar11] = s[iVar12];
        iVar9 = 1;
      }
      uVar10 = iVar9 + iVar11;
      iVar12 = iVar12 + 1;
      sVar3 = strlen(s);
      sVar2 = (size_t)uVar10;
    } while (iVar12 < (int)sVar3);
  }
  local_1038[(int)uVar10] = '\0';
  fprintf((FILE *)wr,"%s\r\n",local_1038);
  spc.pc = spc.pc + o;
  return;
}

Assistant:

void disas(byte o, const char *s, byte a = 0, byte b = 0, byte c = 0, byte d = 0) {
char ws[4096], t[16];
int i, x, pos = 0, z;
uint v;
  if(spc.addr == true) {
    sprintf(ws, "%04x: ", spc.pc);
  } else {
    strcpy(ws, "");
  }
  if(spc.hex == true) {
    for(i=0;i<o;i++) {
      sprintf(t, "%02x ", spc.mem[spc.pc+i]);
      strcat(ws, t);
    }
    for(;i<3;i++) {
      strcat(ws, "   ");
    }
    strcat(ws, " ");
  }
  z=strlen(ws);
  for(i=0;i<(int)strlen(s);i++) {
    if(s[i]=='*') {
      x=s[++i];
      if(x=='b') {
        if     (pos == 0)v=spc.mem[spc.pc+a];
        else if(pos == 1)v=spc.mem[spc.pc+b];
        else if(pos == 2)v=spc.mem[spc.pc+c];
        else if(pos == 3)v=spc.mem[spc.pc+d];
        pos++;
        sprintf(t, "%02x", v&0xff);
      } else if(x=='w') {
        if     (pos == 0)v=spc.mem[spc.pc+a]|(spc.mem[spc.pc+a+1]<<8);
        else if(pos == 1)v=spc.mem[spc.pc+b]|(spc.mem[spc.pc+b+1]<<8);
        else if(pos == 2)v=spc.mem[spc.pc+c]|(spc.mem[spc.pc+c+1]<<8);
        else if(pos == 3)v=spc.mem[spc.pc+d]|(spc.mem[spc.pc+d+1]<<8);
        pos++;
        sprintf(t, "%04x", v&0xffff);
      } else if(x=='m') {
        if     (pos == 0)v=spc.mem[spc.pc+a]|(spc.mem[spc.pc+a+1]<<8);
        else if(pos == 1)v=spc.mem[spc.pc+b]|(spc.mem[spc.pc+b+1]<<8);
        else if(pos == 2)v=spc.mem[spc.pc+c]|(spc.mem[spc.pc+c+1]<<8);
        else if(pos == 3)v=spc.mem[spc.pc+d]|(spc.mem[spc.pc+d+1]<<8);
        pos++;
        sprintf(t, "%04x,%d", v&0x1fff, v>>13);
      } else if(x=='r') {
        if     (pos == 0)v=spc.mem[spc.pc+a];
        else if(pos == 1)v=spc.mem[spc.pc+b];
        else if(pos == 2)v=spc.mem[spc.pc+c];
        else if(pos == 3)v=spc.mem[spc.pc+d];
        pos++;
        if(spc.rel == true) {
          v=(spc.pc+o)+(signed char)v;
          sprintf(t, "%04x", v&0xffff);
        } else {
          sprintf(t, "%02x", v&0xff);
        }
      }
      ws[z]=0;
      strcat(ws, t);
      z+=strlen(t);
    } else {
      ws[z++]=s[i];
    }
  }
  ws[z]=0;
  fprintf(wr, "%s\r\n", ws);

  spc.pc+=o;
}